

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O0

void __thiscall
beagle::cpu::BeagleCPUImpl<float,_1,_0>::calcCrossProductsStates
          (BeagleCPUImpl<float,_1,_0> *this,int *tipStates,float *preOrderPartial,
          double *categoryRates,float *categoryWeights,double edgeLength,double *outCrossProducts,
          double *outSumSquaredDerivatives)

{
  float fVar1;
  float fVar2;
  double dVar3;
  int iVar4;
  int iVar5;
  allocator_type *__a;
  reference pvVar6;
  long in_RCX;
  long lVar7;
  long in_RDX;
  long in_RSI;
  size_type in_RDI;
  long in_R8;
  long in_R9;
  double in_XMM0_Qa;
  undefined1 auVar8 [16];
  undefined8 uVar12;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [64];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int j_1;
  int k_4;
  double patternWeight_1;
  int j;
  int k_3;
  int k_2;
  float denominator_1;
  int v_1;
  int patternIndex_1;
  float weight_1;
  float scale_1;
  int category_1;
  int k_1;
  double patternWeight;
  int k;
  float denominator;
  int v;
  int patternIndex;
  float weight;
  float scale;
  int category;
  int state;
  float patternDenominator;
  vector<float,_std::allocator<float>_> tmp;
  int pattern;
  vector<float,_std::allocator<float>_> *this_00;
  int in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff34;
  int local_c0;
  int local_bc;
  int local_b8;
  float local_b4;
  int local_a0;
  int local_9c;
  int local_90;
  int local_78;
  float local_70;
  undefined1 local_5d [33];
  int local_3c;
  long local_38;
  double local_30;
  long local_28;
  long local_20;
  long local_18;
  long local_10;
  
  local_38 = in_R9;
  local_30 = in_XMM0_Qa;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  for (local_3c = 0; local_3c < *(int *)(in_RDI + 0x14); local_3c = local_3c + 1) {
    __a = (allocator_type *)(ulong)(uint)(*(int *)(in_RDI + 0x24) * *(int *)(in_RDI + 0x24));
    local_5d._1_4_ = 0;
    this_00 = (vector<float,_std::allocator<float>_> *)local_5d;
    std::allocator<float>::allocator((allocator<float> *)0x1a5082);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)
               CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),in_RDI,
               (value_type_conflict2 *)this_00,__a);
    std::allocator<float>::~allocator((allocator<float> *)0x1a50b0);
    local_70 = 0.0;
    iVar5 = *(int *)(local_10 + (long)local_3c * 4);
    if (iVar5 < *(int *)(in_RDI + 0x24)) {
      for (local_78 = 0; local_78 < *(int *)(in_RDI + 0x34); local_78 = local_78 + 1) {
        dVar3 = (double)(float)*(double *)(local_20 + (long)local_78 * 8) * local_30;
        fVar1 = *(float *)(local_28 + (long)local_78 * 4);
        iVar4 = (local_78 * *(int *)(in_RDI + 0x14) + local_3c) * *(int *)(in_RDI + 0x2c);
        auVar10 = vfmadd213ss_fma(ZEXT416((uint)fVar1),
                                  ZEXT416(*(uint *)(local_18 + (long)(iVar4 + iVar5) * 4)),
                                  ZEXT416((uint)local_70));
        local_70 = auVar10._0_4_;
        for (local_90 = 0; local_90 < *(int *)(in_RDI + 0x24); local_90 = local_90 + 1) {
          fVar2 = *(float *)(local_18 + (long)(iVar4 + local_90) * 4);
          pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)(local_5d + 5),
                              (long)(local_90 * *(int *)(in_RDI + 0x24) + iVar5));
          auVar10 = vfmadd213ss_fma(ZEXT416((uint)(float)dVar3),ZEXT416((uint)(fVar2 * fVar1)),
                                    ZEXT416((uint)*pvVar6));
          *pvVar6 = auVar10._0_4_;
        }
      }
      auVar8._0_8_ = *(double *)(*(long *)(in_RDI + 0x78) + (long)local_3c * 8) / (double)local_70;
      auVar8._8_8_ = 0;
      auVar10 = auVar8;
      for (local_9c = 0; uVar12 = auVar10._8_8_, local_9c < *(int *)(in_RDI + 0x24);
          local_9c = local_9c + 1) {
        pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                           ((vector<float,_std::allocator<float>_> *)(local_5d + 5),
                            (long)(local_9c * *(int *)(in_RDI + 0x24) + iVar5));
        auVar13._0_8_ = (double)*pvVar6;
        auVar13._8_8_ = uVar12;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = auVar8._0_8_;
        lVar7 = (long)(local_9c * *(int *)(in_RDI + 0x24) + iVar5);
        auVar15._8_8_ = 0;
        auVar15._0_8_ = *(ulong *)(local_38 + lVar7 * 8);
        auVar10 = vfmadd213sd_fma(auVar9,auVar13,auVar15);
        *(long *)(local_38 + lVar7 * 8) = auVar10._0_8_;
      }
    }
    else {
      for (local_a0 = 0; local_a0 < *(int *)(in_RDI + 0x34); local_a0 = local_a0 + 1) {
        dVar3 = (double)(float)*(double *)(local_20 + (long)local_a0 * 8) * local_30;
        fVar1 = *(float *)(local_28 + (long)local_a0 * 4);
        iVar5 = (local_a0 * *(int *)(in_RDI + 0x14) + local_3c) * *(int *)(in_RDI + 0x2c);
        local_b4 = 0.0;
        for (local_b8 = 0; local_b8 < *(int *)(in_RDI + 0x24); local_b8 = local_b8 + 1) {
          local_b4 = *(float *)(local_18 + (long)(iVar5 + local_b8) * 4) + local_b4;
        }
        auVar10 = vfmadd213ss_fma(ZEXT416((uint)fVar1),ZEXT416((uint)local_b4),
                                  ZEXT416((uint)local_70));
        local_70 = auVar10._0_4_;
        for (local_bc = 0; local_bc < *(int *)(in_RDI + 0x24); local_bc = local_bc + 1) {
          for (local_c0 = 0; local_c0 < *(int *)(in_RDI + 0x24); local_c0 = local_c0 + 1) {
            fVar2 = *(float *)(local_18 + (long)(iVar5 + local_bc) * 4);
            pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                               ((vector<float,_std::allocator<float>_> *)(local_5d + 5),
                                (long)(local_bc * *(int *)(in_RDI + 0x24) + local_c0));
            auVar10 = vfmadd213ss_fma(ZEXT416((uint)(float)dVar3),ZEXT416((uint)(fVar2 * fVar1)),
                                      ZEXT416((uint)*pvVar6));
            *pvVar6 = auVar10._0_4_;
          }
        }
      }
      auVar10._0_8_ = *(double *)(*(long *)(in_RDI + 0x78) + (long)local_3c * 8) / (double)local_70;
      auVar11 = ZEXT864((ulong)auVar10._0_8_);
      for (in_stack_ffffffffffffff34 = 0; in_stack_ffffffffffffff34 < *(int *)(in_RDI + 0x24);
          in_stack_ffffffffffffff34 = in_stack_ffffffffffffff34 + 1) {
        for (in_stack_ffffffffffffff30 = 0; uVar12 = auVar11._8_8_,
            in_stack_ffffffffffffff30 < *(int *)(in_RDI + 0x24);
            in_stack_ffffffffffffff30 = in_stack_ffffffffffffff30 + 1) {
          pvVar6 = std::vector<float,_std::allocator<float>_>::operator[]
                             ((vector<float,_std::allocator<float>_> *)(local_5d + 5),
                              (long)(in_stack_ffffffffffffff34 * *(int *)(in_RDI + 0x24) +
                                    in_stack_ffffffffffffff30));
          auVar14._0_8_ = (double)*pvVar6;
          auVar14._8_8_ = uVar12;
          auVar10._8_8_ = 0;
          lVar7 = (long)(in_stack_ffffffffffffff34 * *(int *)(in_RDI + 0x24) +
                        in_stack_ffffffffffffff30);
          auVar16._8_8_ = 0;
          auVar16._0_8_ = *(ulong *)(local_38 + lVar7 * 8);
          auVar14 = vfmadd213sd_fma(auVar10,auVar14,auVar16);
          auVar11 = ZEXT1664(auVar14);
          *(long *)(local_38 + lVar7 * 8) = auVar14._0_8_;
        }
      }
    }
    std::vector<float,_std::allocator<float>_>::~vector(this_00);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcCrossProductsStates(const int *tipStates,
                                                                const REALTYPE *preOrderPartial,
                                                                const double *categoryRates,
                                                                const REALTYPE *categoryWeights,
                                                                const double edgeLength,
                                                                double *outCrossProducts,
                                                                double *outSumSquaredDerivatives) {

    for (int pattern = 0; pattern < kPatternCount; pattern++) {

        std::vector<REALTYPE> tmp(kStateCount * kStateCount, 0.0); // TODO Handle temporary memory better

        REALTYPE patternDenominator = 0.0;

        const int state = tipStates[pattern];

        if (state < kStateCount) {

            for (int category = 0; category < kCategoryCount; category++) {

                const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;

                const REALTYPE weight = categoryWeights[category];
                const int patternIndex = category * kPatternCount + pattern;
                const int v = patternIndex * kPartialsPaddedStateCount;

                REALTYPE denominator = preOrderPartial[v + state];
                patternDenominator += denominator * weight;

                for (int k = 0; k < kStateCount; k++) {
                    tmp[k * kStateCount + state] += preOrderPartial[v + k] * weight * scale;
                }
            }

            const auto patternWeight = gPatternWeights[pattern] / patternDenominator;
            for (int k = 0; k < kStateCount; k++) {
                outCrossProducts[k * kStateCount + state] += tmp[k * kStateCount + state] * patternWeight;
            }

        } else { // Missing character

            for (int category = 0; category < kCategoryCount; category++) {

                const REALTYPE scale = (REALTYPE) categoryRates[category] * edgeLength;

                const REALTYPE weight = categoryWeights[category];
                const int patternIndex = category * kPatternCount + pattern;
                const int v = patternIndex * kPartialsPaddedStateCount;

                REALTYPE denominator = 0.0;
                for (int k = 0; k < kStateCount; k++) {
                    denominator += preOrderPartial[v + k];
                }
                patternDenominator += denominator * weight;

                for (int k = 0; k < kStateCount; k++) {
                    for (int j = 0; j < kStateCount; j++) {
                        tmp[k * kStateCount + j] += preOrderPartial[v + k] * weight * scale;
                    }
                }
            }

            const auto patternWeight = gPatternWeights[pattern] / patternDenominator;
            for (int k = 0; k < kStateCount; k++) {
                for (int j = 0; j < kStateCount; j++) {
                    outCrossProducts[k * kStateCount + j] += tmp[k * kStateCount + j] * patternWeight;
                }
            }
        }
    }
}